

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * mjs::get_this_arg(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                         value *this_arg)

{
  long *plVar1;
  gc_heap_ptr_untyped local_28;
  
  if (this_arg->type_ < boolean) {
    local_28.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_28.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_28.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_28.heap_,&local_28);
    }
    __return_storage_ptr__->type_ = object;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_28.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_28.pos_;
    if (local_28.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_28.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  else {
    plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar1 + 0x88))(&local_28,plVar1,this_arg);
    __return_storage_ptr__->type_ = object;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_28.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_28.pos_;
    if (local_28.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_28.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_28);
  return __return_storage_ptr__;
}

Assistant:

value get_this_arg(const gc_heap_ptr<global_object>& global, const value& this_arg) {
    if (this_arg.type() == value_type::undefined || this_arg.type() == value_type::null) {
        return value{global};
    } else {
        return value{global->to_object(this_arg)};
    }
}